

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall inja::StatisticsVisitor::visit(StatisticsVisitor *this,FunctionNode *node)

{
  bool bVar1;
  __shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<inja::ExpressionNode> *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  *__range2;
  FunctionNode *node_local;
  StatisticsVisitor *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ::begin(&node->arguments);
  n = (shared_ptr<inja::ExpressionNode> *)
      std::
      vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ::end(&node->arguments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<inja::ExpressionNode>_*,_std::vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>_>
                                *)&n);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<inja::ExpressionNode>_*,_std::vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>_>
               ::operator*(&__end2);
    peVar2 = std::
             __shared_ptr_access<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (**(peVar2->super_AstNode)._vptr_AstNode)(peVar2,this);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<inja::ExpressionNode>_*,_std::vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void visit(const FunctionNode& node) {
    for (const auto& n : node.arguments) {
      n->accept(*this);
    }
  }